

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O0

void __thiscall
EnrichableAnalyzerSubprocess::Marker::Marker
          (Marker *this,U8 _sampleNumber,string *_channelName,MarkerType _markerType)

{
  MarkerType _markerType_local;
  string *_channelName_local;
  U8 _sampleNumber_local;
  Marker *this_local;
  
  std::__cxx11::string::string((string *)&this->channelName);
  this->sampleNumber = _sampleNumber;
  std::__cxx11::string::operator=((string *)&this->channelName,(string *)_channelName);
  this->markerType = _markerType;
  return;
}

Assistant:

EnrichableAnalyzerSubprocess::Marker::Marker(
	U8 _sampleNumber, std::string _channelName, AnalyzerResults::MarkerType _markerType
) {
	sampleNumber = _sampleNumber;
	channelName = _channelName;
	markerType = _markerType;
}